

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::CheckExceptVar(Validator *this,Var *var,Exception **out_except)

{
  bool bVar1;
  Result result;
  size_type sVar2;
  const_reference ppEVar3;
  uint local_2c;
  Exception **ppEStack_28;
  Index index;
  Exception **out_except_local;
  Var *var_local;
  Validator *this_local;
  
  ppEStack_28 = out_except;
  out_except_local = (Exception **)var;
  var_local = (Var *)this;
  sVar2 = std::vector<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>::size
                    (&this->current_module_->excepts);
  result = CheckVar(this,(Index)sVar2,(Var *)out_except_local,"except",&local_2c);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (ppEStack_28 != (Exception **)0x0) {
      ppEVar3 = std::vector<wabt::Exception_*,_std::allocator<wabt::Exception_*>_>::operator[]
                          (&this->current_module_->excepts,(ulong)local_2c);
      *ppEStack_28 = *ppEVar3;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::CheckExceptVar(const Var* var, const Exception** out_except) {
  Index index;
  CHECK_RESULT(
      CheckVar(current_module_->excepts.size(), var, "except", &index));
  if (out_except) {
    *out_except = current_module_->excepts[index];
  }
  return Result::Ok;
}